

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O0

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *a2ab_,LOs *ab2b_,Read<signed_char> *codes_)

{
  Read<int> local_48;
  Read<int> local_38;
  Read<signed_char> *local_28;
  Read<signed_char> *codes__local;
  LOs *ab2b__local;
  LOs *a2ab__local;
  Adj *this_local;
  
  local_28 = codes_;
  codes__local = (Read<signed_char> *)ab2b_;
  ab2b__local = a2ab_;
  a2ab__local = (LOs *)this;
  Read<int>::Read(&local_38,a2ab_);
  Read<int>::Read(&local_48,ab2b_);
  Graph::Graph(&this->super_Graph,&local_38,&local_48);
  Read<int>::~Read(&local_48);
  Read<int>::~Read(&local_38);
  Read<signed_char>::Read(&this->codes,codes_);
  return;
}

Assistant:

Adj(LOs a2ab_, LOs ab2b_, Read<I8> codes_)
      : Graph(a2ab_, ab2b_), codes(codes_) {}